

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::buildGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,
          _geometry_shader_input gs_input,_geometry_shader_output gs_output,
          uint n_primitives_to_emit_in_stream0,uint n_streams)

{
  uint uVar1;
  _geometry_shader_output _Var2;
  ostream *poVar3;
  _geometry_shader_input gs_input_00;
  _geometry_shader_output gs_output_00;
  uint n_stream;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  uint n_stream_1;
  bool bVar7;
  string gs_output_string;
  string gs_input_string;
  stringstream gs_body_sstream;
  _geometry_shader_output local_214;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  getGLSLStringForGSInput_abi_cxx11_
            (&local_1d8,(PipelineStatisticsQueryUtilities *)((ulong)this & 0xffffffff),gs_input_00);
  getGLSLStringForGSOutput_abi_cxx11_
            (&local_1f8,(PipelineStatisticsQueryUtilities *)(ulong)gs_input,gs_output_00);
  getNumberOfVerticesForGSOutput(gs_input);
  pcVar5 = "#version 150\n";
  if (1 < n_primitives_to_emit_in_stream0) {
    pcVar5 = "#version 400";
  }
  poVar3 = std::operator<<(&local_1a8,pcVar5);
  poVar3 = std::operator<<(poVar3,"\nlayout(");
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,")                 in;\nlayout(");
  poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
  poVar3 = std::operator<<(poVar3,", max_vertices=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,") out;\n");
  if (1 < n_primitives_to_emit_in_stream0) {
    std::operator<<(&local_1a8,"\n");
    for (uVar4 = 0; n_primitives_to_emit_in_stream0 != uVar4; uVar4 = uVar4 + 1) {
      poVar3 = std::operator<<(&local_1a8,"layout(stream = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,") out vec4 out_stream");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,";\n");
    }
  }
  std::operator<<(&local_1a8,"\nvoid main()\n{\n");
  uVar1 = getNumberOfVerticesForGSOutput(gs_input);
  local_214 = gs_output;
  for (uVar4 = 0; uVar4 != n_primitives_to_emit_in_stream0; uVar4 = uVar4 + 1) {
    _Var2 = GEOMETRY_SHADER_OUTPUT_FIRST;
    while( true ) {
      uVar6 = uVar1;
      if (_Var2 == local_214) break;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        std::operator<<(&local_1a8,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n");
        pcVar5 = "    EmitVertex();\n";
        poVar3 = &local_1a8;
        if (n_primitives_to_emit_in_stream0 != 1) {
          poVar3 = std::operator<<(&local_1a8,"    EmitStreamVertex(");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          pcVar5 = ");\n";
        }
        std::operator<<(poVar3,pcVar5);
      }
      pcVar5 = "    EndPrimitive();\n";
      poVar3 = &local_1a8;
      if (n_primitives_to_emit_in_stream0 != 1) {
        poVar3 = std::operator<<(&local_1a8,"    EndStreamPrimitive(");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        pcVar5 = ");\n";
      }
      std::operator<<(poVar3,pcVar5);
      _Var2 = _Var2 + GEOMETRY_SHADER_OUTPUT_LINE_STRIP;
    }
    local_214 = local_214 + GEOMETRY_SHADER_OUTPUT_LINE_STRIP;
  }
  std::operator<<(&local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::buildGeometryShaderBody(_geometry_shader_input  gs_input,
																	  _geometry_shader_output gs_output,
																	  unsigned int n_primitives_to_emit_in_stream0,
																	  unsigned int n_streams)
{
	DE_ASSERT(n_primitives_to_emit_in_stream0 >= 1);
	DE_ASSERT(n_streams >= 1);

	/* Each stream will output (n+1) primitives, where n corresponds to the number of primitives emitted
	 * by the previous stream. Stream 0 emits user-defined number of primitievs.
	 */
	std::stringstream gs_body_sstream;
	const std::string gs_input_string  = getGLSLStringForGSInput(gs_input);
	const std::string gs_output_string = getGLSLStringForGSOutput(gs_output);
	unsigned int	  n_max_vertices   = 0;
	unsigned int	  n_vertices_required_for_gs_output =
		PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput(gs_output);

	for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
	{
		n_max_vertices += n_vertices_required_for_gs_output * (n_primitives_to_emit_in_stream0 + n_stream);
	} /* for (all streams) */

	/* Form the preamble. Note that we need to use the right ES SL version,
	 * since vertex streams are not a core GL3.2 feature.
	 **/
	gs_body_sstream << ((n_streams > 1) ? "#version 400" : "#version 150\n") << "\n"
																				"layout("
					<< gs_input_string << ")                 in;\n"
										  "layout("
					<< gs_output_string << ", max_vertices=" << n_max_vertices << ") out;\n";

	/* If we need to define multiple streams, do it now */
	if (n_streams > 1)
	{
		gs_body_sstream << "\n";

		for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
		{
			gs_body_sstream << "layout(stream = " << n_stream << ") out vec4 out_stream" << n_stream << ";\n";
		} /* for (all streams) */
	}	 /* if (n_streams > 1) */

	/* Contine forming actual body */
	gs_body_sstream << "\n"
					   "void main()\n"
					   "{\n";

	/* Emit primitives */
	const unsigned int n_output_primitive_vertices =
		PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput(gs_output);

	for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
	{
		const unsigned int n_primitives_to_emit = n_primitives_to_emit_in_stream0 + n_stream;

		for (unsigned int n_primitive = 0; n_primitive < n_primitives_to_emit; ++n_primitive)
		{
			for (unsigned int n_vertex = 0; n_vertex < n_output_primitive_vertices; ++n_vertex)
			{
				gs_body_sstream << "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n";

				if (n_streams == 1)
				{
					gs_body_sstream << "    EmitVertex();\n";
				}
				else
				{
					gs_body_sstream << "    EmitStreamVertex(" << n_stream << ");\n";
				}
			}

			if (n_streams == 1)
			{
				gs_body_sstream << "    EndPrimitive();\n";
			}
			else
			{
				gs_body_sstream << "    EndStreamPrimitive(" << n_stream << ");\n";
			}
		} /* for (all primitives the caller wants the shader to emit) */
	}	 /* for (all streams) */

	gs_body_sstream << "}\n";

	return gs_body_sstream.str();
}